

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unowned_ptr.cpp
# Opt level: O0

void __thiscall Unowned_Create_Test::~Unowned_Create_Test(Unowned_Create_Test *this)

{
  Unowned_Create_Test *this_local;
  
  ~Unowned_Create_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(Unowned, Create)
{
    int i = 5;

    unowned_ptr<int> a {};
    unowned_ptr<int> b { nullptr };
    unowned_ptr<int> c { &i };

    EXPECT_FALSE(a);
    EXPECT_FALSE(b);
    EXPECT_TRUE(c);

    EXPECT_EQ(a, b);
    EXPECT_NE(a, c);
}